

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O2

spv_result_t spvTextToLiteral(char *textValue,spv_literal_t *pLiteral)

{
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  value_t vVar4;
  int iVar5;
  byte bVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  
  sVar3 = strlen(textValue);
  if (sVar3 == 0) {
    return SPV_FAILED_MATCH;
  }
  bVar6 = 0;
  iVar5 = 0;
  bVar2 = false;
  for (uVar8 = 0; uVar8 < sVar3; uVar8 = uVar8 + 1) {
    bVar1 = textValue[uVar8];
    if (9 < bVar1 - 0x30) {
      if (bVar1 == 0x2d) {
        bVar6 = bVar6 | uVar8 != 0;
        bVar2 = (bool)(bVar2 | uVar8 == 0);
      }
      else if (bVar1 == 0x2e) {
        iVar5 = iVar5 + 1;
      }
      else {
        bVar6 = 1;
        uVar8 = sVar3;
      }
    }
  }
  pLiteral->type = 99;
  if ((bool)(bVar6 | 1 < iVar5)) {
    if (sVar3 == 1) {
      return SPV_FAILED_MATCH;
    }
    if (*textValue != '\"') {
      return SPV_FAILED_MATCH;
    }
    if (textValue[sVar3 - 1] != '\"') {
      return SPV_FAILED_MATCH;
    }
    lVar7 = 0;
    bVar2 = false;
    do {
      if (sVar3 - 2 == lVar7) {
        pLiteral->type = SPV_LITERAL_TYPE_STRING;
        return SPV_SUCCESS;
      }
      bVar2 = (bool)(textValue[lVar7 + 1] == '\\' & (bVar2 ^ 1U));
      if (!bVar2) {
        if (0x3fffb < (pLiteral->str)._M_string_length) {
          return SPV_ERROR_OUT_OF_MEMORY;
        }
        std::__cxx11::string::push_back((char)pLiteral + '\x10');
      }
      lVar7 = lVar7 + 1;
    } while( true );
  }
  if ((bool)(sVar3 == 1 & bVar2)) {
    return SPV_FAILED_MATCH;
  }
  if (iVar5 == 1) {
    dVar9 = strtod(textValue,(char **)0x0);
    dVar10 = (double)(float)dVar9;
    if ((dVar9 == dVar10) && (!NAN(dVar9) && !NAN(dVar10))) {
      pLiteral->type = SPV_LITERAL_TYPE_FLOAT_32;
      (pLiteral->value).f = (float)dVar9;
      return SPV_SUCCESS;
    }
    pLiteral->type = SPV_LITERAL_TYPE_FLOAT_64;
    (pLiteral->value).d = dVar9;
    return SPV_SUCCESS;
  }
  if (bVar2) {
    vVar4.i64 = strtoll(textValue,(char **)0x0,10);
    if (vVar4.i32 != vVar4.i64) {
      pLiteral->type = SPV_LITERAL_TYPE_INT_64;
LAB_00545856:
      pLiteral->value = vVar4;
      return SPV_SUCCESS;
    }
    pLiteral->type = SPV_LITERAL_TYPE_INT_32;
  }
  else {
    vVar4.u64 = strtoull(textValue,(char **)0x0,10);
    if (vVar4.u64 >> 0x20 != 0) {
      pLiteral->type = SPV_LITERAL_TYPE_UINT_64;
      goto LAB_00545856;
    }
    pLiteral->type = SPV_LITERAL_TYPE_UINT_32;
  }
  (pLiteral->value).i32 = vVar4.i32;
  return SPV_SUCCESS;
}

Assistant:

spv_result_t spvTextToLiteral(const char* textValue, spv_literal_t* pLiteral) {
  bool isSigned = false;
  int numPeriods = 0;
  bool isString = false;

  const size_t len = strlen(textValue);
  if (len == 0) return SPV_FAILED_MATCH;

  for (uint64_t index = 0; index < len; ++index) {
    switch (textValue[index]) {
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        break;
      case '.':
        numPeriods++;
        break;
      case '-':
        if (index == 0) {
          isSigned = true;
        } else {
          isString = true;
        }
        break;
      default:
        isString = true;
        index = len;  // break out of the loop too.
        break;
    }
  }

  pLiteral->type = spv_literal_type_t(99);

  if (isString || numPeriods > 1 || (isSigned && len == 1)) {
    if (len < 2 || textValue[0] != '"' || textValue[len - 1] != '"')
      return SPV_FAILED_MATCH;
    bool escaping = false;
    for (const char* val = textValue + 1; val != textValue + len - 1; ++val) {
      if ((*val == '\\') && (!escaping)) {
        escaping = true;
      } else {
        // Have to save space for the null-terminator
        if (pLiteral->str.size() >= SPV_LIMIT_LITERAL_STRING_BYTES_MAX)
          return SPV_ERROR_OUT_OF_MEMORY;
        pLiteral->str.push_back(*val);
        escaping = false;
      }
    }

    pLiteral->type = SPV_LITERAL_TYPE_STRING;
  } else if (numPeriods == 1) {
    double d = std::strtod(textValue, nullptr);
    float f = (float)d;
    if (d == (double)f) {
      pLiteral->type = SPV_LITERAL_TYPE_FLOAT_32;
      pLiteral->value.f = f;
    } else {
      pLiteral->type = SPV_LITERAL_TYPE_FLOAT_64;
      pLiteral->value.d = d;
    }
  } else if (isSigned) {
    int64_t i64 = strtoll(textValue, nullptr, 10);
    int32_t i32 = (int32_t)i64;
    if (i64 == (int64_t)i32) {
      pLiteral->type = SPV_LITERAL_TYPE_INT_32;
      pLiteral->value.i32 = i32;
    } else {
      pLiteral->type = SPV_LITERAL_TYPE_INT_64;
      pLiteral->value.i64 = i64;
    }
  } else {
    uint64_t u64 = strtoull(textValue, nullptr, 10);
    uint32_t u32 = (uint32_t)u64;
    if (u64 == (uint64_t)u32) {
      pLiteral->type = SPV_LITERAL_TYPE_UINT_32;
      pLiteral->value.u32 = u32;
    } else {
      pLiteral->type = SPV_LITERAL_TYPE_UINT_64;
      pLiteral->value.u64 = u64;
    }
  }

  return SPV_SUCCESS;
}